

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

void P_NewChaseDir(AActor *actor)

{
  TObjPtr<AActor> *obj;
  uint uVar1;
  sector_t_conflict *psVar2;
  AWeapon *pAVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  line_t_conflict *ld;
  double dVar9;
  double dVar10;
  FBlockLinesIterator it;
  int local_e8;
  uint uStack_e4;
  int iStack_e0;
  uint uStack_dc;
  double local_d0;
  double local_c8;
  DVector2 local_b8;
  DVector3 local_a8;
  FBoundingBox local_88;
  int local_68;
  uint uStack_64;
  int iStack_60;
  uint uStack_5c;
  
  actor->strafecount = 0;
  if (((actor->flags5).Value & 0x80) == 0) {
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)&actor->target);
    pAVar8 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
    if (pAVar8 == pAVar7) goto LAB_003fbf35;
LAB_003fbf70:
    obj = &actor->target;
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar7 == (AActor *)0x0) {
      Printf("P_NewChaseDir: called with no target\n");
      P_RandomChaseDir(actor);
      return;
    }
    GC::ReadBarrier<AActor>((AActor **)obj);
    AActor::Vec2To((AActor *)&stack0xffffffffffffff98,actor);
    local_e8 = local_68;
    uStack_e4 = uStack_64;
    iStack_e0 = iStack_60;
    uStack_dc = uStack_5c;
    if ((((actor->flags6).Value & 0x10) == 0) &&
       (((pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar7->player != (player_t *)0x0 &&
         (pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj), (pAVar7->player->cheats & 0x400) != 0))
        || (((actor->flags4).Value & 0x40000000) != 0)))) {
      uStack_e4 = uStack_64 ^ 0x80000000;
      uStack_dc = uStack_5c ^ 0x80000000;
    }
  }
  else {
LAB_003fbf35:
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
    if (pAVar7 == (AActor *)0x0) goto LAB_003fbf70;
    GC::ReadBarrier<AActor>((AActor **)&actor->goal);
    AActor::Vec2To((AActor *)&stack0xffffffffffffff98,actor);
    local_e8 = local_68;
    uStack_e4 = uStack_64;
    iStack_e0 = iStack_60;
    uStack_dc = uStack_5c;
  }
  dVar9 = actor->floorz - actor->dropoffz;
  if (((actor->MaxDropOffHeight <= dVar9 && dVar9 != actor->MaxDropOffHeight) &&
      ((actor->__Pos).Z <= actor->floorz)) &&
     ((uVar1 = (actor->flags).Value, (uVar1 >> 10 & 1) == 0 &&
      (((uVar1 & 0x4000) == 0 && ((actor->flags2).Value & 0x800) == 0 &&
       ((i_compatflags._1_1_ & 0x40) == 0)))))) {
    dVar9 = actor->radius;
    local_88.m_Box[2] = (actor->__Pos).X;
    local_88.m_Box[1] = (actor->__Pos).Y;
    local_88.m_Box[0] = local_88.m_Box[1] + dVar9;
    local_88.m_Box[3] = local_88.m_Box[2] + dVar9;
    local_88.m_Box[1] = local_88.m_Box[1] - dVar9;
    local_88.m_Box[2] = local_88.m_Box[2] - dVar9;
    FBlockLinesIterator::FBlockLinesIterator
              ((FBlockLinesIterator *)&stack0xffffffffffffff98,&local_88);
    local_c8 = 0.0;
    local_d0 = 0.0;
LAB_003fc0c3:
    ld = FBlockLinesIterator::Next((FBlockLinesIterator *)&stack0xffffffffffffff98);
    if (ld != (line_t_conflict *)0x0) {
      if (((ld->backsector != (sector_t_conflict *)0x0) &&
          (bVar5 = FBoundingBox::inRange(&local_88,ld), bVar5)) &&
         (iVar6 = FBoundingBox::BoxOnLineSide(&local_88,(line_t *)ld), iVar6 == -1)) {
        psVar2 = ld->frontsector;
        AActor::PosRelative(&local_a8,actor,ld);
        local_b8.X = local_a8.X;
        local_b8.Y = local_a8.Y;
        dVar10 = secplane_t::ZatPoint(&psVar2->floorplane,&local_b8);
        psVar2 = ld->backsector;
        AActor::PosRelative(&local_a8,actor,ld);
        local_b8.X = local_a8.X;
        local_b8.Y = local_a8.Y;
        dVar4 = secplane_t::ZatPoint(&psVar2->floorplane,&local_b8);
        dVar9 = (actor->__Pos).Z;
        if (((dVar4 != dVar9) || (NAN(dVar4) || NAN(dVar9))) ||
           (dVar9 - actor->MaxDropOffHeight <= dVar10)) {
          if (((dVar10 != dVar9) || (NAN(dVar10) || NAN(dVar9))) ||
             (dVar9 - actor->MaxDropOffHeight <= dVar4)) goto LAB_003fc0c3;
          local_a8.X = (ld->delta).X;
          local_a8.Y = (ld->delta).Y;
          TVector2<double>::Angle(&local_b8);
          dVar9 = local_b8.X + 180.0;
        }
        else {
          local_a8.X = (ld->delta).X;
          local_a8.Y = (ld->delta).Y;
          TVector2<double>::Angle(&local_b8);
          dVar9 = local_b8.X;
        }
        dVar10 = fastsindeg(dVar9);
        local_d0 = local_d0 - dVar10 * 32.0;
        dVar9 = fastcosdeg(dVar9);
        local_c8 = local_c8 + dVar9 * 32.0;
      }
      goto LAB_003fc0c3;
    }
    if ((((local_d0 != 0.0) || (NAN(local_d0))) || (local_c8 != 0.0)) || (NAN(local_c8))) {
      *(byte *)&(actor->flags5).Value = (byte)(actor->flags5).Value | 0x20;
      P_DoNewChaseDir(actor,local_d0,local_c8);
      *(byte *)&(actor->flags5).Value = (byte)(actor->flags5).Value & 0xdf;
      actor->movecount = 1;
      return;
    }
  }
  pAVar7 = GC::ReadBarrier<AActor>((AActor **)&actor->target);
  if (((0 < pAVar7->health) && (bVar5 = AActor::IsFriend(actor,pAVar7), !bVar5)) &&
     ((pAVar8 = GC::ReadBarrier<AActor>((AActor **)&actor->goal), pAVar7 != pAVar8 &&
      (((actor->flags3).Value & 0x800000) != 0)))) {
    dVar9 = AActor::Distance2D(actor,pAVar7,false);
    if (pAVar7->player == (player_t *)0x0) {
      if ((pAVar7->MissileState != (FState *)0x0) ||
         (dVar10 = pAVar7->meleerange + pAVar7->radius, dVar10 + dVar10 <= dVar9))
      goto LAB_003fc2f7;
    }
    else {
      pAVar3 = pAVar7->player->ReadyWeapon;
      if (((pAVar3 == (AWeapon *)0x0) || (192.0 <= dVar9)) ||
         ((*(uint *)&(pAVar3->super_AStateProvider).super_AInventory.field_0x4fc & 0x8000) == 0))
      goto LAB_003fc2f7;
    }
    iVar6 = FRandom::operator()(&pr_enemystrafe);
    actor->strafecount = (ushort)iVar6 & 0xf;
    uStack_e4 = uStack_e4 ^ 0x80000000;
    uStack_dc = uStack_dc ^ 0x80000000;
  }
LAB_003fc2f7:
  P_DoNewChaseDir(actor,(double)CONCAT44(uStack_e4,local_e8),(double)CONCAT44(uStack_dc,iStack_e0));
  if (actor->strafecount != 0) {
    actor->movecount = actor->strafecount;
  }
  return;
}

Assistant:

void P_NewChaseDir(AActor * actor)
{
	DVector2 delta;

	actor->strafecount = 0;

	if ((actor->flags5&MF5_CHASEGOAL || actor->goal == actor->target) && actor->goal!=NULL)
	{
		delta = actor->Vec2To(actor->goal);
	}
	else if (actor->target != NULL)
	{
		delta = actor->Vec2To(actor->target);

		if (!(actor->flags6 & MF6_NOFEAR))
		{
			if ((actor->target->player != NULL && (actor->target->player->cheats & CF_FRIGHTENING)) || 
				(actor->flags4 & MF4_FRIGHTENED))
			{
				delta = -delta;
			}
		}
	}
	else
	{
		// Don't abort if this happens.
		Printf ("P_NewChaseDir: called with no target\n");
		P_RandomChaseDir(actor);
		return;
	}
	
	// Try to move away from a dropoff
	if (actor->floorz - actor->dropoffz > actor->MaxDropOffHeight && 
		actor->Z() <= actor->floorz && !(actor->flags & MF_DROPOFF) && 
		!(actor->flags2 & MF2_ONMOBJ) &&
		!(actor->flags & MF_FLOAT) && !(i_compatflags & COMPATF_DROPOFF))
	{
		FBoundingBox box(actor->X(), actor->Y(), actor->radius);
		FBlockLinesIterator it(box);
		line_t *line;

		double deltax = 0;
		double deltay = 0;
		while ((line = it.Next()))
		{
			if (line->backsector  && // Ignore one-sided linedefs
				box.inRange(line) &&
				box.BoxOnLineSide(line) == -1)
		    {
				double front = line->frontsector->floorplane.ZatPoint(actor->PosRelative(line));
				double back  = line->backsector->floorplane.ZatPoint(actor->PosRelative(line));
				DAngle angle;
		
				// The monster must contact one of the two floors,
				// and the other must be a tall dropoff.
				
				if (back == actor->Z() && front < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle();   // front side dropoff
				}
				else if (front == actor->Z() && back < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle() + 180.; // back side dropoff
				}
				else continue;
		
				// Move away from dropoff at a standard speed.
				// Multiple contacted linedefs are cumulative (e.g. hanging over corner)
				deltax -= 32 * angle.Sin();
				deltay += 32 * angle.Cos();
			}
		}

		if (deltax != 0 || deltay != 0) 
		{
			// [Graf Zahl] I have changed P_TryMove to only apply this logic when
			// being called from here. AVOIDINGDROPOFF activates the code that
			// allows monsters to move away from a dropoff. This is different from
			// MBF which requires unconditional use of the altered logic and therefore
			// forcing a massive change in the monster behavior to use this.

			// use different dropoff movement logic in P_TryMove
			actor->flags5|=MF5_AVOIDINGDROPOFF;
			P_DoNewChaseDir(actor, deltax, deltay);
			actor->flags5&=~MF5_AVOIDINGDROPOFF;
		
			// If moving away from dropoff, set movecount to 1 so that 
			// small steps are taken to get monster away from dropoff.
			actor->movecount = 1;
			return;
		}
	}

#if 0
	// Move away from friends when too close, except
	// in certain situations (e.g. a crowded lift)

	// MBF code for friends. Cannot be done in ZDoom but left here as a reminder for later implementation.

	if (actor->flags & target->flags & MF_FRIEND &&
	    distfriend > dist && 
	    !P_IsOnLift(target) && !P_IsUnderDamage(actor))
	  deltax = -deltax, deltay = -deltay;
	else
#endif

	// MBF's monster_backing option. Made an actor flag instead. Also cleaned the code up to make it readable.
	// Todo: implement the movement logic
	AActor *target = actor->target;
	if (target->health > 0 && !actor->IsFriend(target) && target != actor->goal)
    {   // Live enemy target

		if (actor->flags3 & MF3_AVOIDMELEE)
		{
			bool ismeleeattacker = false;
			double dist = actor->Distance2D(target);
			if (target->player == NULL)
			{
				ismeleeattacker = (target->MissileState == NULL && dist < (target->meleerange + target->radius)*2);
			}
			else if (target->player->ReadyWeapon != NULL)
			{
				// melee range of player weapon is a parameter of the action function and cannot be checked here.
				// Add a new weapon property?
				ismeleeattacker = ((target->player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON) && dist < 192);
			}
			if (ismeleeattacker)
			{
				actor->strafecount = pr_enemystrafe() & 15;
				delta = -delta;
			}
	    }
	}

	P_DoNewChaseDir(actor, delta.X, delta.Y);

	// If strafing, set movecount to strafecount so that old Doom
	// logic still works the same, except in the strafing part

	if (actor->strafecount)
		actor->movecount = actor->strafecount;

}